

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O2

void __thiscall sf::priv::WindowImplX11::setProtocols(WindowImplX11 *this)

{
  bool bVar1;
  __pid_t _Var2;
  Atom AVar3;
  Atom AVar4;
  Atom AVar5;
  ostream *poVar6;
  allocator local_79;
  long pid;
  vector<unsigned_long,_std::allocator<unsigned_long>_> atoms;
  Atom netWmPing;
  Atom wmDeleteWindow;
  
  std::__cxx11::string::string((string *)&pid,"WM_PROTOCOLS",(allocator *)&atoms);
  AVar3 = getAtom((string *)&pid,false);
  std::__cxx11::string::~string((string *)&pid);
  std::__cxx11::string::string((string *)&pid,"WM_DELETE_WINDOW",(allocator *)&atoms);
  AVar4 = getAtom((string *)&pid,false);
  std::__cxx11::string::~string((string *)&pid);
  wmDeleteWindow = AVar4;
  if (AVar3 == 0) {
    poVar6 = err();
    poVar6 = std::operator<<(poVar6,"Failed to request WM_PROTOCOLS atom.");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  else {
    atoms.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    atoms.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    atoms.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (AVar4 == 0) {
      poVar6 = err();
      poVar6 = std::operator<<(poVar6,"Failed to request WM_DELETE_WINDOW atom.");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&atoms,&wmDeleteWindow);
    }
    netWmPing = 0;
    bVar1 = anon_unknown.dwarf_1b7f4f::WindowsImplX11Impl::ewmhSupported();
    if (bVar1) {
      std::__cxx11::string::string((string *)&pid,"_NET_WM_PING",&local_79);
      AVar4 = getAtom((string *)&pid,true);
      netWmPing = AVar4;
      std::__cxx11::string::~string((string *)&pid);
      std::__cxx11::string::string((string *)&pid,"_NET_WM_PID",&local_79);
      AVar5 = getAtom((string *)&pid,true);
      std::__cxx11::string::~string((string *)&pid);
      if (AVar5 != 0 && AVar4 != 0) {
        _Var2 = getpid();
        pid = (long)_Var2;
        XChangeProperty(this->m_display,this->m_window,AVar5,6,0x20,0,(string *)&pid,1);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&atoms,&netWmPing);
      }
    }
    if (atoms.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        atoms.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      poVar6 = err();
      poVar6 = std::operator<<(poVar6,"Didn\'t set any window protocols");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    else {
      XChangeProperty(this->m_display,this->m_window,AVar3,4,0x20,0,
                      atoms.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)atoms.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)atoms.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&atoms.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  return;
}

Assistant:

void WindowImplX11::setProtocols()
{
    using namespace WindowsImplX11Impl;

    Atom wmProtocols = getAtom("WM_PROTOCOLS");
    Atom wmDeleteWindow = getAtom("WM_DELETE_WINDOW");

    if (!wmProtocols)
    {
        err() << "Failed to request WM_PROTOCOLS atom." << std::endl;
        return;
    }

    std::vector<Atom> atoms;

    if (wmDeleteWindow)
    {
        atoms.push_back(wmDeleteWindow);
    }
    else
    {
        err() << "Failed to request WM_DELETE_WINDOW atom." << std::endl;
    }

    Atom netWmPing = None;
    Atom netWmPid = None;

    if (ewmhSupported())
    {
        netWmPing = getAtom("_NET_WM_PING", true);
        netWmPid = getAtom("_NET_WM_PID", true);
    }

    if (netWmPing && netWmPid)
    {
        const long pid = getpid();

        XChangeProperty(m_display,
                        m_window,
                        netWmPid,
                        XA_CARDINAL,
                        32,
                        PropModeReplace,
                        reinterpret_cast<const unsigned char*>(&pid),
                        1);

        atoms.push_back(netWmPing);
    }

    if (!atoms.empty())
    {
        XChangeProperty(m_display,
                        m_window,
                        wmProtocols,
                        XA_ATOM,
                        32,
                        PropModeReplace,
                        reinterpret_cast<const unsigned char*>(&atoms[0]),
                        static_cast<int>(atoms.size()));
    }
    else
    {
        err() << "Didn't set any window protocols" << std::endl;
    }
}